

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

void stb_getopt_free(char **opts)

{
  int local_28;
  char **local_20;
  char **o2;
  char **ppcStack_10;
  int i;
  char **opts_local;
  
  o2._4_4_ = 0;
  local_20 = opts;
  ppcStack_10 = opts;
  while( true ) {
    if (local_20 == (char **)0x0) {
      local_28 = 0;
    }
    else {
      local_28 = *(int *)(local_20 + -2);
    }
    if (local_28 <= o2._4_4_) break;
    free(local_20[o2._4_4_]);
    o2._4_4_ = o2._4_4_ + 1;
  }
  stb_arr_free_(&local_20);
  return;
}

Assistant:

void   stb_getopt_free(char **opts)
{
   int i;
   char ** o2 = opts;
   for (i=0; i < stb_arr_len(o2); ++i)
      free(o2[i]);
   stb_arr_free(o2);
}